

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

ConstantInt * __thiscall LLVMBC::SwitchInst::Case::getCaseValue(Case *this)

{
  ValueKind VVar1;
  Value *this_00;
  LoggingCallback p_Var2;
  void *pvVar3;
  char acStack_1018 [4104];
  
  this_00 = Internal::resolve_proxy(this->value);
  VVar1 = Value::get_value_kind(this_00);
  if (VVar1 == ConstantInt) {
    return (ConstantInt *)this_00;
  }
  p_Var2 = ::dxil_spv::get_thread_log_callback();
  if (p_Var2 == (LoggingCallback)0x0) {
    getCaseValue();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var2)(pvVar3,Error,acStack_1018);
  std::terminate();
}

Assistant:

ConstantInt *SwitchInst::Case::getCaseValue() const
{
	return cast<ConstantInt>(value);
}